

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimeparser.cpp
# Opt level: O1

void __thiscall
QtMWidgets::Section::fillValues
          (Section *this,QDateTime *current,QDateTime *min,QDateTime *max,bool updateIndex)

{
  QVector<QString> *this_00;
  Type TVar1;
  bool bVar2;
  Data *pDVar3;
  qsizetype qVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  uint uVar8;
  char16_t *pcVar9;
  undefined3 in_register_00000081;
  int i;
  uint uVar10;
  uint uVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QLatin1String QVar14;
  QLatin1String QVar15;
  QLatin1String QVar16;
  QLatin1String QVar17;
  QLatin1String QVar18;
  QLatin1String QVar19;
  QLatin1String QVar20;
  QLatin1String QVar21;
  QLatin1String QVar22;
  QLatin1String QVar23;
  QString v;
  QDate date;
  QString local_80;
  QString local_68;
  QDateTime *local_50;
  uint local_48;
  uint local_44;
  QDate local_40;
  QLocale local_38 [8];
  
  uVar8 = CONCAT31(in_register_00000081,updateIndex);
  this_00 = &this->values;
  local_50 = current;
  QList<QString>::clear(this_00);
  if (uVar8 != 0) {
    this->currentIndex = -1;
  }
  TVar1 = this->type;
  local_48 = uVar8;
  if ((int)TVar1 < 0x80) {
    if ((int)TVar1 < 0x10) {
      switch(TVar1) {
      case AmPmSection:
        local_68.d.d = (Data *)0x0;
        local_68.d.ptr = (char16_t *)0x0;
        local_68.d.size = 0;
        QVar12.m_data = (storage_type *)0x2;
        QVar12.m_size = (qsizetype)&local_80;
        QString::fromLatin1(QVar12);
        qVar4 = local_68.d.size;
        pcVar9 = local_68.d.ptr;
        pDVar3 = local_68.d.d;
        local_68.d.d = local_80.d.d;
        local_80.d.d = pDVar3;
        local_68.d.ptr = local_80.d.ptr;
        local_68.d.size = local_80.d.size;
        local_80.d.ptr = pcVar9;
        local_80.d.size = qVar4;
        if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar3->super_QArrayData,2,8);
          }
        }
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)this_00,(this->values).d.size,&local_68);
        if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
          }
        }
        local_68.d.d = (Data *)0x0;
        local_68.d.ptr = (char16_t *)0x0;
        local_68.d.size = 0;
        QVar13.m_data = (storage_type *)0x2;
        QVar13.m_size = (qsizetype)&local_80;
        QString::fromLatin1(QVar13);
        qVar4 = local_68.d.size;
        pcVar9 = local_68.d.ptr;
        pDVar3 = local_68.d.d;
        local_68.d.d = local_80.d.d;
        local_80.d.d = pDVar3;
        local_68.d.ptr = local_80.d.ptr;
        local_68.d.size = local_80.d.size;
        local_80.d.ptr = pcVar9;
        local_80.d.size = qVar4;
        if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar3->super_QArrayData,2,8);
          }
        }
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)this_00,(this->values).d.size,&local_68);
        if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
          }
        }
        uVar7 = QDateTime::time();
        local_80.d.d = (Data *)CONCAT44(local_80.d.d._4_4_,uVar7);
        iVar5 = QTime::hour();
        if (iVar5 < 0xc) {
          this->currentIndex = 0;
        }
        else {
          this->currentIndex = 1;
        }
        break;
      case SecondSection:
        uVar7 = QDateTime::time();
        local_80.d.d = (Data *)CONCAT44(local_80.d.d._4_4_,uVar7);
        uVar8 = QTime::second();
        uVar11 = 0;
        do {
          local_68.d.d = (Data *)0x0;
          local_68.d.ptr = (char16_t *)0x0;
          local_68.d.size = 0;
          if ((uVar11 < 10) && (this->zeroesAdded != false)) {
            QVar18.m_data = (char *)0x1;
            QVar18.m_size = (qsizetype)&local_68;
            QString::append(QVar18);
          }
          QString::number((int)&local_80,uVar11);
          QString::append(&local_68);
          if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,8);
            }
          }
          if (uVar8 == uVar11) {
            this->currentIndex = (int)(this->values).d.size;
          }
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)this_00,(this->values).d.size,&local_68);
          if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
            }
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != 0x3c);
        break;
      case MinuteSection:
        uVar7 = QDateTime::time();
        local_80.d.d = (Data *)CONCAT44(local_80.d.d._4_4_,uVar7);
        uVar8 = QTime::minute();
        uVar11 = 0;
        do {
          local_68.d.d = (Data *)0x0;
          local_68.d.ptr = (char16_t *)0x0;
          local_68.d.size = 0;
          if ((uVar11 < 10) && (this->zeroesAdded != false)) {
            QVar17.m_data = (char *)0x1;
            QVar17.m_size = (qsizetype)&local_68;
            QString::append(QVar17);
          }
          QString::number((int)&local_80,uVar11);
          QString::append(&local_68);
          if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,8);
            }
          }
          if (uVar8 == uVar11) {
            this->currentIndex = (int)(this->values).d.size;
          }
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)this_00,(this->values).d.size,&local_68);
          if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
            }
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != 0x3c);
        break;
      case Hour12Section:
        uVar7 = QDateTime::time();
        local_80.d.d = (Data *)CONCAT44(local_80.d.d._4_4_,uVar7);
        uVar11 = QTime::hour();
        uVar8 = uVar11 - 0xc;
        if ((int)uVar11 < 0xd) {
          uVar8 = uVar11;
        }
        uVar10 = 0xc;
        if (uVar11 != 0) {
          uVar10 = uVar8;
        }
        uVar8 = 1;
        do {
          local_68.d.d = (Data *)0x0;
          local_68.d.ptr = (char16_t *)0x0;
          local_68.d.size = 0;
          if ((uVar8 < 10) && (this->zeroesAdded != false)) {
            QVar16.m_data = (char *)0x1;
            QVar16.m_size = (qsizetype)&local_68;
            QString::append(QVar16);
          }
          QString::number((int)&local_80,uVar8);
          QString::append(&local_68);
          if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,8);
            }
          }
          if (uVar10 == uVar8) {
            this->currentIndex = (int)(this->values).d.size;
          }
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)this_00,(this->values).d.size,&local_68);
          if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
            }
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != 0xd);
      }
    }
    else if (TVar1 == Hour24Section) {
      uVar7 = QDateTime::time();
      local_80.d.d = (Data *)CONCAT44(local_80.d.d._4_4_,uVar7);
      uVar8 = QTime::hour();
      uVar11 = 0;
      do {
        local_68.d.d = (Data *)0x0;
        local_68.d.ptr = (char16_t *)0x0;
        local_68.d.size = 0;
        if ((uVar11 < 10) && (this->zeroesAdded != false)) {
          QVar19.m_data = (char *)0x1;
          QVar19.m_size = (qsizetype)&local_68;
          QString::append(QVar19);
        }
        QString::number((int)&local_80,uVar11);
        QString::append(&local_68);
        if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,8);
          }
        }
        if (uVar8 == uVar11) {
          this->currentIndex = (int)(this->values).d.size;
        }
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)this_00,(this->values).d.size,&local_68);
        if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
          }
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != 0x18);
    }
    else if (TVar1 == DaySection) {
      local_80.d.d = (Data *)QDateTime::date();
      local_44 = QDate::day();
      local_80.d.d = (Data *)QDateTime::date();
      iVar5 = QDate::daysInMonth();
      if (0 < iVar5) {
        local_48 = local_48 ^ 1;
        uVar8 = 1;
        do {
          local_68.d.d = (Data *)0x0;
          local_68.d.ptr = (char16_t *)0x0;
          local_68.d.size = 0;
          if ((uVar8 < 10) && (this->zeroesAdded != false)) {
            QVar20.m_data = (char *)0x1;
            QVar20.m_size = (qsizetype)&local_68;
            QString::append(QVar20);
          }
          QString::number((int)&local_80,uVar8);
          QString::append(&local_68);
          if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,8);
            }
          }
          if (local_44 == uVar8 && (char)local_48 == '\0') {
            this->currentIndex = (int)(this->values).d.size;
          }
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)this_00,(this->values).d.size,&local_68);
          if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
            }
          }
          local_80.d.d = (Data *)QDateTime::date();
          iVar5 = QDate::daysInMonth();
          bVar2 = (int)uVar8 < iVar5;
          uVar8 = uVar8 + 1;
        } while (bVar2);
      }
    }
    else if (TVar1 == DaySectionShort) {
      local_80.d.d = (Data *)QDateTime::date();
      local_44 = QDate::day();
      local_80.d.d = (Data *)QDateTime::date();
      iVar5 = QDate::year();
      local_68.d.d = (Data *)QDateTime::date();
      iVar6 = QDate::month();
      QDate::QDate(&local_40,iVar5,iVar6,1);
      local_80.d.d = (Data *)QDateTime::date();
      iVar5 = QDate::daysInMonth();
      if (0 < iVar5) {
        local_48 = local_48 ^ 1;
        uVar8 = 1;
        do {
          local_68.d.d = (Data *)0x0;
          local_68.d.ptr = (char16_t *)0x0;
          local_68.d.size = 0;
          if ((uVar8 < 10) && (this->zeroesAdded != false)) {
            QVar14.m_data = (char *)0x1;
            QVar14.m_size = (qsizetype)&local_68;
            QString::append(QVar14);
          }
          QString::number((int)&local_80,uVar8);
          QString::append(&local_68);
          if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,8);
            }
          }
          if (local_44 == uVar8 && (char)local_48 == '\0') {
            this->currentIndex = (int)(this->values).d.size;
          }
          QString::insert((longlong)&local_68,(QChar)0x0);
          QLocale::system();
          QDate::dayOfWeek();
          QLocale::dayName((int)&local_80,(FormatType)local_38);
          pcVar9 = local_80.d.ptr;
          if (local_80.d.ptr == (char16_t *)0x0) {
            pcVar9 = (char16_t *)&QString::_empty;
          }
          QString::insert((longlong)&local_68,(QChar *)0x0,(longlong)pcVar9);
          if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,8);
            }
          }
          QLocale::~QLocale(local_38);
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)this_00,(this->values).d.size,&local_68);
          local_40.jd = QDate::addDays((longlong)&local_40);
          if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
            }
          }
          local_80.d.d = (Data *)QDateTime::date();
          iVar5 = QDate::daysInMonth();
          bVar2 = (int)uVar8 < iVar5;
          uVar8 = uVar8 + 1;
        } while (bVar2);
      }
    }
  }
  else if ((int)TVar1 < 0x400) {
    if (TVar1 == DaySectionLong) {
      local_80.d.d = (Data *)QDateTime::date();
      local_44 = QDate::day();
      local_80.d.d = (Data *)QDateTime::date();
      iVar5 = QDate::year();
      local_68.d.d = (Data *)QDateTime::date();
      iVar6 = QDate::month();
      QDate::QDate(&local_40,iVar5,iVar6,1);
      local_80.d.d = (Data *)QDateTime::date();
      iVar5 = QDate::daysInMonth();
      if (0 < iVar5) {
        local_48 = local_48 ^ 1;
        uVar8 = 1;
        do {
          local_68.d.d = (Data *)0x0;
          local_68.d.ptr = (char16_t *)0x0;
          local_68.d.size = 0;
          if ((uVar8 < 10) && (this->zeroesAdded != false)) {
            QVar21.m_data = (char *)0x1;
            QVar21.m_size = (qsizetype)&local_68;
            QString::append(QVar21);
          }
          QString::number((int)&local_80,uVar8);
          QString::append(&local_68);
          if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,8);
            }
          }
          if (local_44 == uVar8 && (char)local_48 == '\0') {
            this->currentIndex = (int)(this->values).d.size;
          }
          QString::insert((longlong)&local_68,(QChar)0x0);
          QLocale::system();
          QDate::dayOfWeek();
          QLocale::dayName((int)&local_80,(FormatType)local_38);
          pcVar9 = local_80.d.ptr;
          if (local_80.d.ptr == (char16_t *)0x0) {
            pcVar9 = (char16_t *)&QString::_empty;
          }
          QString::insert((longlong)&local_68,(QChar *)0x0,(longlong)pcVar9);
          if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,8);
            }
          }
          QLocale::~QLocale(local_38);
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)this_00,(this->values).d.size,&local_68);
          local_40.jd = QDate::addDays((longlong)&local_40);
          if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
            }
          }
          local_80.d.d = (Data *)QDateTime::date();
          iVar5 = QDate::daysInMonth();
          bVar2 = (int)uVar8 < iVar5;
          uVar8 = uVar8 + 1;
        } while (bVar2);
      }
    }
    else if (TVar1 == MonthSection) {
      local_80.d.d = (Data *)QDateTime::date();
      uVar8 = QDate::month();
      uVar11 = 1;
      do {
        local_68.d.d = (Data *)0x0;
        local_68.d.ptr = (char16_t *)0x0;
        local_68.d.size = 0;
        if ((uVar11 < 10) && (this->zeroesAdded != false)) {
          QVar22.m_data = (char *)0x1;
          QVar22.m_size = (qsizetype)&local_68;
          QString::append(QVar22);
        }
        QString::number((int)&local_80,uVar11);
        QString::append(&local_68);
        if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,8);
          }
        }
        if (uVar8 == uVar11) {
          this->currentIndex = (int)(this->values).d.size;
        }
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)this_00,(this->values).d.size,&local_68);
        if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
          }
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != 0xd);
    }
    else if (TVar1 == MonthSectionShort) {
      local_80.d.d = (Data *)QDateTime::date();
      iVar5 = QDate::month();
      iVar6 = 1;
      do {
        if (iVar5 == iVar6) {
          this->currentIndex = (int)(this->values).d.size;
        }
        QLocale::system();
        QLocale::monthName((int)&local_80,(FormatType)(QLocale *)&local_68);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)this_00,(this->values).d.size,&local_80);
        if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,8);
          }
        }
        QLocale::~QLocale((QLocale *)&local_68);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 0xd);
    }
  }
  else if (TVar1 == MonthSectionLong) {
    local_80.d.d = (Data *)QDateTime::date();
    iVar5 = QDate::month();
    iVar6 = 1;
    do {
      if (iVar5 == iVar6) {
        this->currentIndex = (int)(this->values).d.size;
      }
      QLocale::system();
      QLocale::monthName((int)&local_80,(FormatType)(QLocale *)&local_68);
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)this_00,(this->values).d.size,&local_80);
      if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,8);
        }
      }
      QLocale::~QLocale((QLocale *)&local_68);
      iVar6 = iVar6 + 1;
    } while (iVar6 != 0xd);
  }
  else if (TVar1 == YearSection) {
    local_80.d.d = (Data *)QDateTime::date();
    uVar8 = QDate::year();
    local_80.d.d = (Data *)QDateTime::date();
    iVar5 = QDate::year();
    local_80.d.d = (Data *)QDateTime::date();
    uVar7 = QDate::year();
    local_50 = (QDateTime *)CONCAT44(local_50._4_4_,uVar7);
    if ((int)uVar8 <= iVar5) {
      do {
        local_68.d.d = (Data *)0x0;
        local_68.d.ptr = (char16_t *)0x0;
        local_68.d.size = 0;
        if ((uVar8 < 10) && (this->zeroesAdded != false)) {
          QVar23.m_data = (char *)0x1;
          QVar23.m_size = (qsizetype)&local_68;
          QString::append(QVar23);
        }
        QString::number((int)&local_80,uVar8);
        QString::append(&local_68);
        if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,8);
          }
        }
        if ((uint)local_50 == uVar8) {
          this->currentIndex = (int)(this->values).d.size;
        }
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)this_00,(this->values).d.size,&local_68);
        if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
          }
        }
        uVar8 = uVar8 + 1;
      } while (iVar5 + 1U != uVar8);
    }
  }
  else if (TVar1 == YearSection2Digits) {
    local_80.d.d = (Data *)QDateTime::date();
    uVar8 = QDate::year();
    local_80.d.d = (Data *)QDateTime::date();
    iVar5 = QDate::year();
    local_80.d.d = (Data *)QDateTime::date();
    uVar7 = QDate::year();
    local_50 = (QDateTime *)CONCAT44(local_50._4_4_,uVar7);
    if ((int)uVar8 <= iVar5) {
      do {
        local_68.d.d = (Data *)0x0;
        local_68.d.ptr = (char16_t *)0x0;
        local_68.d.size = 0;
        if ((uVar8 < 10) && (this->zeroesAdded != false)) {
          QVar15.m_data = (char *)0x1;
          QVar15.m_size = (qsizetype)&local_68;
          QString::append(QVar15);
        }
        QString::number((int)&local_80,uVar8);
        QString::append(&local_68);
        if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,8);
          }
        }
        if ((uint)local_50 == uVar8) {
          this->currentIndex = (int)(this->values).d.size;
        }
        QString::right((longlong)&local_80);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)this_00,(this->values).d.size,&local_80);
        if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,8);
          }
        }
        if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
          }
        }
        uVar8 = uVar8 + 1;
      } while (iVar5 + 1U != uVar8);
    }
  }
  return;
}

Assistant:

void
Section::fillValues( const QDateTime & current,
	const QDateTime & min, const QDateTime & max,
	bool updateIndex )
{
	values.clear();

	if( updateIndex )
		currentIndex = -1;

	switch( type )
	{
		case AmPmSection :
		{
			values.append( QLatin1String( "AM" ) );
			values.append( QLatin1String( "PM" ) );

			if( current.time().hour() >= 12 )
				currentIndex = 1;
			else
				currentIndex = 0;
		}
		break;

		case SecondSection :
		{
			const int s = current.time().second();

			for( int i = 0; i < 60; ++i )
			{
				QString v;

				makeSectionValue( v, i, zeroesAdded );

				if( s == i )
					currentIndex = values.size();

				values.append( v );
			}
		}
		break;

		case MinuteSection :
		{
			const int m = current.time().minute();

			for( int i = 0; i < 60; ++i )
			{
				QString v;

				makeSectionValue( v, i, zeroesAdded );

				if( m == i )
					currentIndex = values.size();

				values.append( v );
			}
		}
		break;

		case Hour12Section :
		{
			int h = 0;
			int currentHour = current.time().hour();

			if( currentHour == 0 )
				h = 12;
			else if( currentHour > 12 )
				h = currentHour - 12;
			else
				h = currentHour;

			for( int i = 1; i < 13; ++i )
			{
				QString v;

				makeSectionValue( v, i, zeroesAdded );

				if( h == i )
					currentIndex = values.size();

				values.append( v );
			}
		}
		break;

		case Hour24Section :
		{
			const int h = current.time().hour();

			for( int i = 0; i < 24; ++i )
			{
				QString v;

				makeSectionValue( v, i, zeroesAdded );

				if( h == i )
					currentIndex = values.size();

				values.append( v );
			}
		}
		break;

		case DaySection :
		{
			const int d = current.date().day();

			for( int i = 1; i <= current.date().daysInMonth(); ++i )
			{
				QString v;

				makeSectionValue( v, i, zeroesAdded );

				if( updateIndex && d == i )
					currentIndex = values.size();

				values.append( v );
			}
		}
		break;

		case DaySectionShort :
		{
			const int d = current.date().day();

			QDate date( current.date().year(), current.date().month(), 1 );

			for( int i = 1; i <= current.date().daysInMonth(); ++i )
			{
				QString v;

				makeSectionValue( v, i, zeroesAdded );

				if( updateIndex && d == i )
					currentIndex = values.size();

				v.prepend( QLatin1Char( ' ' ) );

				v.prepend( QLocale::system().dayName( date.dayOfWeek(), QLocale::ShortFormat ) );

				values.append( v );

				date = date.addDays( 1 );
			}
		}
		break;

		case DaySectionLong :
		{
			const int d = current.date().day();

			QDate date( current.date().year(), current.date().month(), 1 );

			for( int i = 1; i <= current.date().daysInMonth(); ++i )
			{
				QString v;

				makeSectionValue( v, i, zeroesAdded );

				if( updateIndex && d == i )
					currentIndex = values.size();

				v.prepend( QLatin1Char( ' ' ) );

				v.prepend( QLocale::system().dayName( date.dayOfWeek() ) );

				values.append( v );

				date = date.addDays( 1 );
			}
		}
		break;

		case MonthSection :
		{
			const int m = current.date().month();

			for( int i = 1; i < 13; ++i )
			{
				QString v;

				makeSectionValue( v, i, zeroesAdded );

				if( m == i )
					currentIndex = values.size();

				values.append( v );
			}
		}
		break;

		case MonthSectionShort :
		{
			const int m = current.date().month();

			for( int i = 1; i < 13; ++i )
			{
				if( m == i )
					currentIndex = values.size();

				values.append( QLocale::system().monthName( i, QLocale::ShortFormat ) );
			}
		}
		break;

		case MonthSectionLong :
		{
			const int m = current.date().month();

			for( int i = 1; i < 13; ++i )
			{
				if( m == i )
					currentIndex = values.size();

				values.append( QLocale::system().monthName( i ) );
			}
		}
		break;

		case YearSection :
		{
			int start = min.date().year();
			const int finish = max.date().year();
			const int y = current.date().year();

			while( start <= finish )
			{
				QString v;

				makeSectionValue( v, start, zeroesAdded );

				if( start == y )
					currentIndex = values.size();

				values.append( v );

				++start;
			}
		}
		break;

		case YearSection2Digits :
		{
			int start = min.date().year();
			const int finish = max.date().year();
			const int y = current.date().year();

			while( start <= finish )
			{
				QString v;

				makeSectionValue( v, start, zeroesAdded );

				if( start == y )
					currentIndex = values.size();

				values.append( v.right( 2 ) );

				++start;
			}
		}
		break;

		default:
			break;
	}
}